

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_RET(Context *ctx)

{
  Buffer *pBVar1;
  
  ctx->indent = ctx->indent + -1;
  output_line(ctx,"}");
  if (ctx->output == (Buffer *)0x0) {
    __assert_fail("ctx->output != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1d3,"void output_blank_line(Context *)");
  }
  if (ctx->isfail == 0) {
    buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
  }
  pBVar1 = ctx->subroutines;
  if (pBVar1 == (Buffer *)0x0) {
    pBVar1 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->subroutines = pBVar1;
    if (pBVar1 == (Buffer *)0x0) {
      return;
    }
  }
  ctx->output = pBVar1;
  return;
}

Assistant:

static void emit_GLSL_RET(Context *ctx)
{
    // thankfully, the MSDN specs say a RET _has_ to end a function...no
    //  early returns. So if you hit one, you know you can safely close
    //  a high-level function.
    ctx->indent--;
    output_line(ctx, "}");
    output_blank_line(ctx);
    set_output(ctx, &ctx->subroutines);  // !!! FIXME: is this for LABEL? Maybe set it there so we don't allocate unnecessarily.
}